

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteCamerasLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t a;
  ulong pIndex;
  
  if ((this->mScene->mCameras != (aiCamera **)0x0) && (this->mScene->mNumCameras != 0)) {
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<library_cameras>");
    std::operator<<(poVar1,(string *)&this->endstr);
    PushTag(this);
    for (pIndex = 0; pIndex < this->mScene->mNumCameras; pIndex = pIndex + 1) {
      WriteCamera(this,pIndex);
    }
    PopTag(this);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"</library_cameras>");
    std::operator<<(poVar1,(string *)&this->endstr);
    return;
  }
  return;
}

Assistant:

void ColladaExporter::WriteCamerasLibrary() {
    if(mScene->HasCameras()) {

        mOutput << startstr << "<library_cameras>" << endstr;
        PushTag();

        for( size_t a = 0; a < mScene->mNumCameras; ++a)
            WriteCamera( a);

        PopTag();
        mOutput << startstr << "</library_cameras>" << endstr;

    }
}